

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O1

void __thiscall
iutest::AssertionHelper::ScopedMessage::ScopedMessage(ScopedMessage *this,iuCodeMessage *msg)

{
  size_t *psVar1;
  pointer pcVar2;
  ScopedTrace *pSVar3;
  _List_node_base *p_Var4;
  
  (this->super_iuCodeMessage).m_message._M_dataplus._M_p =
       (pointer)&(this->super_iuCodeMessage).m_message.field_2;
  pcVar2 = (msg->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + (msg->m_message)._M_string_length);
  (this->super_iuCodeMessage).m_line = msg->m_line;
  (this->super_iuCodeMessage).m_file = msg->m_file;
  pSVar3 = ScopedTrace::GetInstance();
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = (_List_node_base *)this;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(pSVar3->list).
            super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

ScopedMessage(const detail::iuCodeMessage& msg) // NOLINT
            : detail::iuCodeMessage(msg)
        {
            ScopedTrace::GetInstance().list.push_back(this);
        }